

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::serializeTo
          (StructuredAssignmentPatternExpression *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  bool bVar1;
  reference pMVar2;
  Type *__n;
  Expression *pEVar3;
  ASTSerializer *in_RSI;
  long in_RDI;
  IndexSetter *setter_2;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *__range3_2;
  TypeSetter *setter_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *__range3_1;
  MemberSetter *setter;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *__range3;
  ASTSerializer *in_stack_fffffffffffffe98;
  ASTSerializer *in_stack_fffffffffffffea0;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *in_stack_fffffffffffffea8;
  ASTSerializer *pAVar4;
  ASTSerializer *in_stack_fffffffffffffeb0;
  ASTSerializer *in_stack_fffffffffffffeb8;
  ASTSerializer *in_stack_fffffffffffffec0;
  int local_110;
  void *local_108;
  int local_100;
  void *local_f8;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
  local_e0;
  long local_d8;
  undefined8 local_c0;
  void *local_b8;
  undefined8 local_b0;
  void *local_a8;
  reference local_a0;
  TypeSetter *local_98;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
  local_90;
  long local_88;
  undefined8 local_70;
  Symbol *in_stack_ffffffffffffff98;
  ASTSerializer *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
  local_40;
  long local_38;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x70) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    ASTSerializer::write(in_RSI,local_20,local_18,*(size_t *)(in_RDI + 0x70));
  }
  bVar1 = std::
          span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          ::empty((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                   *)0x7efb6d);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    name._M_str = (char *)in_stack_fffffffffffffec0;
    name._M_len = (size_t)in_stack_fffffffffffffeb8;
    ASTSerializer::startArray(in_stack_fffffffffffffeb0,name);
    local_38 = in_RDI + 0x40;
    local_40._M_current =
         (MemberSetter *)
         std::
         span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                  *)in_stack_fffffffffffffe98);
    std::
    span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
    ::end(in_stack_fffffffffffffea8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe98);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pMVar2 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
               ::operator*(&local_40);
      ASTSerializer::startObject((ASTSerializer *)0x7efc2d);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8);
      not_null<const_slang::ast::Symbol_*>::operator*
                ((not_null<const_slang::ast::Symbol_*> *)0x7efc5b);
      name_02._M_str = (char *)pMVar2;
      name_02._M_len = in_stack_ffffffffffffffa8;
      ASTSerializer::writeLink(in_stack_ffffffffffffffa0,name_02,in_stack_ffffffffffffff98);
      pAVar4 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8);
      pEVar3 = not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0x7efcaa);
      ASTSerializer::write(pAVar4,(int)local_70,in_stack_ffffffffffffff98,(size_t)pEVar3);
      ASTSerializer::endObject((ASTSerializer *)0x7efcd4);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
      ::operator++(&local_40);
    }
    ASTSerializer::endArray((ASTSerializer *)0x7efcf3);
  }
  bVar1 = std::
          span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          ::empty((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                   *)0x7efd01);
  if (!bVar1) {
    in_stack_fffffffffffffec0 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    name_00._M_str = (char *)in_stack_fffffffffffffec0;
    name_00._M_len = (size_t)in_stack_fffffffffffffeb8;
    ASTSerializer::startArray(in_stack_fffffffffffffeb0,name_00);
    local_88 = in_RDI + 0x50;
    local_90._M_current =
         (TypeSetter *)
         std::
         span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *)in_stack_fffffffffffffe98);
    local_98 = (TypeSetter *)
               std::
               span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
               ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                      *)in_stack_fffffffffffffea8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe98);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                 ::operator*(&local_90);
      ASTSerializer::startObject((ASTSerializer *)0x7efdc1);
      in_stack_fffffffffffffeb0 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                 (char *)in_stack_fffffffffffffea8);
      __n = not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x7efdef);
      ASTSerializer::write(in_stack_fffffffffffffeb0,(int)local_b0,local_a8,(size_t)__n);
      in_stack_fffffffffffffeb8 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)in_stack_fffffffffffffea8);
      pEVar3 = not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0x7efe3e);
      ASTSerializer::write(in_stack_fffffffffffffeb8,(int)local_c0,local_b8,(size_t)pEVar3);
      ASTSerializer::endObject((ASTSerializer *)0x7efe68);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
      ::operator++(&local_90);
    }
    ASTSerializer::endArray((ASTSerializer *)0x7efe87);
  }
  bVar1 = std::
          span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          ::empty((span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                   *)0x7efe95);
  if (!bVar1) {
    pAVar4 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)local_10);
    name_01._M_str = (char *)in_stack_fffffffffffffec0;
    name_01._M_len = (size_t)in_stack_fffffffffffffeb8;
    ASTSerializer::startArray(in_stack_fffffffffffffeb0,name_01);
    local_d8 = in_RDI + 0x60;
    local_e0._M_current =
         (IndexSetter *)
         std::
         span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                  *)in_stack_fffffffffffffe98);
    std::
    span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
    ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
           *)pAVar4);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe98);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
      ::operator*(&local_e0);
      ASTSerializer::startObject((ASTSerializer *)0x7eff52);
      in_stack_fffffffffffffe98 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)pAVar4);
      pEVar3 = not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0x7eff79);
      ASTSerializer::write(in_stack_fffffffffffffe98,local_100,local_f8,(size_t)pEVar3);
      in_stack_fffffffffffffea0 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
                 (char *)pAVar4);
      pEVar3 = not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0x7effbb);
      ASTSerializer::write(in_stack_fffffffffffffea0,local_110,local_108,(size_t)pEVar3);
      ASTSerializer::endObject((ASTSerializer *)0x7effdf);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
      ::operator++(&local_e0);
    }
    ASTSerializer::endArray((ASTSerializer *)0x7efffe);
  }
  return;
}

Assistant:

void StructuredAssignmentPatternExpression::serializeTo(ASTSerializer& serializer) const {
    if (defaultSetter)
        serializer.write("defaultSetter", *defaultSetter);

    if (!memberSetters.empty()) {
        serializer.startArray("memberSetters");
        for (auto& setter : memberSetters) {
            serializer.startObject();
            serializer.writeLink("member", *setter.member);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (!typeSetters.empty()) {
        serializer.startArray("typeSetters");
        for (auto& setter : typeSetters) {
            serializer.startObject();
            serializer.write("type", *setter.type);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (!indexSetters.empty()) {
        serializer.startArray("indexSetters");
        for (auto& setter : indexSetters) {
            serializer.startObject();
            serializer.write("index", *setter.index);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}